

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

bool __thiscall pbrt::SquareMatrix<3>::operator==(SquareMatrix<3> *this,SquareMatrix<3> *m2)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  Float *pFVar4;
  Float *pFVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  pFVar4 = m2->m[0] + 1;
  pFVar5 = this->m[0] + 1;
  uVar6 = 0;
  bVar8 = false;
  do {
    fVar1 = this->m[uVar6][0];
    fVar2 = m2->m[uVar6][0];
    if (fVar1 != fVar2) {
      return bVar8;
    }
    if (NAN(fVar1) || NAN(fVar2)) {
      return bVar8;
    }
    uVar3 = 0;
    do {
      uVar7 = uVar3;
      if (uVar7 == 2) goto LAB_00290ae0;
    } while ((pFVar5[uVar7] == pFVar4[uVar7]) &&
            (uVar3 = uVar7 + 1, !NAN(pFVar5[uVar7]) && !NAN(pFVar4[uVar7])));
    if (uVar7 < 2) {
      return bVar8;
    }
LAB_00290ae0:
    bVar8 = 1 < uVar6;
    uVar6 = uVar6 + 1;
    pFVar4 = pFVar4 + 3;
    pFVar5 = pFVar5 + 3;
    if (uVar6 == 3) {
      return bVar8;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool operator==(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                if (m[i][j] != m2.m[i][j])
                    return false;
        return true;
    }